

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage0.c
# Opt level: O0

_Bool COSE_Mac0_Free(HCOSE_MAC0 h)

{
  _Bool _Var1;
  COSE_Mac0Message *p;
  HCOSE_MAC0 h_local;
  
  _Var1 = IsValidMac0Handle(h);
  if (_Var1) {
    if (*(int *)(h + 0x10) < 2) {
      _COSE_RemoveFromList(&Mac0Root,(COSE *)h);
      _COSE_Mac0_Release((COSE_Mac0Message *)h);
      free(h);
      h_local._7_1_ = true;
    }
    else {
      *(int *)(h + 0x10) = *(int *)(h + 0x10) + -1;
      h_local._7_1_ = true;
    }
  }
  else {
    h_local._7_1_ = false;
  }
  return h_local._7_1_;
}

Assistant:

bool COSE_Mac0_Free(HCOSE_MAC0 h)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context *context;
#endif
	COSE_Mac0Message * p = (COSE_Mac0Message *)h;

	if (!IsValidMac0Handle(h)) return false;

	if (p->m_message.m_refCount > 1) {
		p->m_message.m_refCount--;
		return true;
	}

	_COSE_RemoveFromList(&Mac0Root, &p->m_message);

#ifdef USE_CBOR_CONTEXT
	context = &p->m_message.m_allocContext;
#endif

	_COSE_Mac0_Release(p);

	COSE_FREE(p, context);

	return true;
}